

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ResetObs(ReadData *this)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  ReadData *this_local;
  
  for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
    *(undefined8 *)(&this->field_0x10 + (long)local_14 * 0x70) = 0xbff0000000000000;
    *(undefined8 *)(&this->field_0x18 + (long)local_14 * 0x70) = 0xbff0000000000000;
    *(undefined4 *)(&this->field_0x0 + (long)local_14 * 0x70) = 0;
    *(undefined8 *)(&this->field_0x8 + (long)local_14 * 0x70) = 0xbff0000000000000;
  }
  for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
    *(undefined8 *)(&this->field_0x1c10 + (long)local_18 * 0x70) = 0xbff0000000000000;
    *(undefined8 *)(&this->field_0x1c18 + (long)local_18 * 0x70) = 0xbff0000000000000;
    *(undefined4 *)(&this->field_0x1c00 + (long)local_18 * 0x70) = 0;
    *(undefined8 *)(&this->field_0x1c08 + (long)local_18 * 0x70) = 0xbff0000000000000;
  }
  return 0;
}

Assistant:

int ReadData::ResetObs() {
    for(int i = 0; i < MAXBDSSRN; ++i) {
        this->BDSObs[i].psr[0] = -1;
        this->BDSObs[i].psr[1] = -1;
        this->BDSObs[i].ObsTime.Week = 0;
        this->BDSObs[i].ObsTime.SOW = -1;
    }
    for(int i = 0; i < MAXGPSSRN; ++i) {
        this->GPSObs[i].psr[0] = -1;
        this->GPSObs[i].psr[1] = -1;
        this->GPSObs[i].ObsTime.Week = 0;
        this->GPSObs[i].ObsTime.SOW = -1;
    }
    return 0;
}